

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QSslCertificate __thiscall QSslSocket::localCertificate(QSslSocket *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RSI + 8) + 0x2d0) == 0) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (char *)0x0;
    local_38.size = 0;
    QSslCertificate::QSslCertificate((QSslCertificate *)this,(QByteArray *)&local_38,Pem);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00230f26;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00230f26:
      __stack_chk_fail();
    }
    QSslCertificate::QSslCertificate
              ((QSslCertificate *)this,*(QSslCertificate **)(*(long *)(in_RSI + 8) + 0x2c8));
  }
  return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
         (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
}

Assistant:

QSslCertificate QSslSocket::localCertificate() const
{
    Q_D(const QSslSocket);
    if (d->configuration.localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->configuration.localCertificateChain[0];
}